

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
* __thiscall
toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>::
invoke<std::__cxx11::string>
          (result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>> *this,
          location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *loc)

{
  bool bVar1;
  const_iterator rollback;
  value_type *other;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *loc_00
  ;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_00;
  success<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  uint local_e0;
  failure_type local_d9;
  char *local_d8;
  undefined1 local_c0 [8];
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  rslt;
  size_t i;
  const_iterator first;
  region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> retval;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *loc_local;
  
  region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::region
            ((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&first,
             (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this);
  rollback = location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::iter((location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this);
  loc_00 = extraout_RDX;
  for (rslt.field_1.succ.value.last_._M_current = (const_iterator)(char *)0x0;
      (ulong)rslt.field_1.succ.value.last_._M_current < (char *)0x3;
      rslt.field_1.succ.value.last_._M_current =
           (const_iterator)((long)rslt.field_1.succ.value.last_._M_current + 1)) {
    character<(char)39>::invoke<std::__cxx11::string>
              ((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                *)local_c0,(character<(char)39> *)this,loc_00);
    bVar1 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
            ::is_err((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                      *)local_c0);
    if (bVar1) {
      local_d8 = rollback._M_current;
      location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this,rollback);
      none();
      result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
      ::result(__return_storage_ptr__,&local_d9);
    }
    else {
      other = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
              ::unwrap((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                        *)local_c0);
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator+=((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&first,other);
    }
    local_e0 = (uint)bVar1;
    result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
    ::~result((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
               *)local_c0);
    if (local_e0 != 0) goto LAB_0015faf0;
    loc_00 = extraout_RDX_00;
  }
  ok<toml::detail::region<std::__cxx11::string>>
            (&local_128,(toml *)&first,
             (region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)loc_00);
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  ::result(__return_storage_ptr__,&local_128);
  success<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~success(&local_128);
  local_e0 = 1;
LAB_0015faf0:
  region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~region
            ((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&first);
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        region<Cont> retval(loc);
        const auto first = loc.iter();
        for(std::size_t i=0; i<N; ++i)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                loc.reset(first);
                return none();
            }
            retval += rslt.unwrap();
        }
        return ok(std::move(retval));
    }